

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O0

Vector<float,_4> __thiscall tcu::Vector<float,_3>::toWidth<4>(Vector<float,_3> *this)

{
  int iVar1;
  long in_RSI;
  undefined8 extraout_XMM0_Qa;
  undefined8 uVar2;
  undefined8 in_XMM1_Qa;
  Vector<float,_4> VVar3;
  int local_1c;
  int i;
  Vector<float,_3> *this_local;
  Vector<float,_4> *res;
  
  Vector<float,_4>::Vector((Vector<float,_4> *)this);
  for (local_1c = 0; iVar1 = deMin32(3,4), uVar2 = extraout_XMM0_Qa, local_1c < iVar1;
      local_1c = local_1c + 1) {
    this->m_data[local_1c] = *(float *)(in_RSI + (long)local_1c * 4);
  }
  for (; local_1c < 4; local_1c = local_1c + 1) {
    uVar2 = 0;
    this->m_data[local_1c] = 0.0;
  }
  VVar3.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar3.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  VVar3.m_data[0] = (float)(int)uVar2;
  VVar3.m_data[1] = (float)(int)((ulong)uVar2 >> 0x20);
  return (Vector<float,_4>)VVar3.m_data;
}

Assistant:

inline Vector<T, NewSize> Vector<T, Size>::toWidth (void) const
{
	Vector<T, NewSize> res;
	int i;
	for (i = 0; i < deMin32(Size, NewSize); i++)
		res.m_data[i] = m_data[i];
	for (; i < NewSize; i++)
		res.m_data[i] = T(0);
	return res;
}